

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsTTDRawBufferModifySyncIndirect(JsValueRef buffer,size_t index,size_t count)

{
  anon_class_24_3_366dd472 fn;
  size_t local_28;
  size_t count_local;
  size_t index_local;
  JsValueRef buffer_local;
  
  if ((index < 0x100000000) && (count < 0x100000000)) {
    fn.index = &local_28;
    fn.buffer = (JsValueRef *)&count_local;
    fn.count = &index_local;
    local_28 = count;
    count_local = index;
    index_local = (size_t)buffer;
    buffer_local._4_4_ = ContextAPIWrapper<false,JsTTDRawBufferModifySyncIndirect::__0>(fn);
  }
  else {
    buffer_local._4_4_ = JsErrorInvalidArgument;
  }
  return buffer_local._4_4_;
}

Assistant:

CHAKRA_API JsTTDRawBufferModifySyncIndirect(_In_ JsValueRef buffer, _In_ size_t index, _In_ size_t count)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    if(index > UINT32_MAX || count > UINT32_MAX)
    {
        return JsErrorInvalidArgument;
    }

    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTRawBufferModifySync, buffer, (uint32)index, (uint32)count);

        return JsNoError;
    });
#endif
}